

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

PathString * wasm::Path::to_path(PathString *__return_storage_ptr__,string *s)

{
  string *s_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

PathString to_path(const std::string& s) { return s; }